

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O2

int amqp_ssl_socket_open(void *base,char *host,int port,timeval *timeout)

{
  int iVar1;
  int iVar2;
  SSL *pSVar3;
  BIO_METHOD *type;
  BIO *bp;
  long lVar4;
  ulong uVar5;
  X509 *a;
  size_t sVar6;
  undefined4 uVar7;
  amqp_time_t deadline;
  
  if (*(int *)((long)base + 0x10) == -1) {
    ERR_clear_error();
    pSVar3 = SSL_new(*(SSL_CTX **)((long)base + 8));
    *(SSL **)((long)base + 0x18) = pSVar3;
    if (pSVar3 == (SSL *)0x0) {
      uVar5 = ERR_peek_error();
      *(int *)((long)base + 0x28) = (int)uVar5;
      iVar1 = -0x200;
    }
    else {
      iVar1 = amqp_time_from_now(&deadline,timeout);
      if (iVar1 == 0) {
        iVar1 = amqp_open_socket_inner(host,port,deadline);
        *(int *)((long)base + 0x10) = iVar1;
        if (iVar1 < 0) {
          iVar2 = amqp_os_socket_error();
          *(int *)((long)base + 0x28) = iVar2;
        }
        else {
          type = (BIO_METHOD *)amqp_openssl_bio();
          bp = BIO_new(type);
          if (bp == (BIO *)0x0) {
            iVar1 = -1;
          }
          else {
            BIO_int_ctrl(bp,0x68,0,*(int *)((long)base + 0x10));
            SSL_set_bio(*(SSL **)((long)base + 0x18),bp,bp);
            lVar4 = SSL_ctrl(*(SSL **)((long)base + 0x18),0x37,0,host);
            if ((int)lVar4 == 0) {
              iVar1 = SSL_get_error(*(SSL **)((long)base + 0x18),0);
              *(int *)((long)base + 0x28) = iVar1;
              iVar1 = -0x200;
            }
            else {
              do {
                iVar1 = SSL_connect(*(SSL **)((long)base + 0x18));
                if (iVar1 == 1) {
                  a = (X509 *)SSL_get1_peer_certificate();
                  if (*(int *)((long)base + 0x20) == 0) {
LAB_0010ae4f:
                    if (*(int *)((long)base + 0x24) == 0) {
LAB_0010ae83:
                      X509_free(a);
                      *(undefined4 *)((long)base + 0x28) = 0;
                      return 0;
                    }
                    if (a != (X509 *)0x0) {
                      sVar6 = strlen(host);
                      uVar7 = 0;
                      iVar2 = X509_check_host(a,host,sVar6,4,0);
                      iVar1 = -0x201;
                      if (iVar2 == 1) goto LAB_0010ae83;
                      goto LAB_0010ae9d;
                    }
                    *(undefined4 *)((long)base + 0x28) = 0;
                    iVar1 = -0x201;
                  }
                  else if (a == (X509 *)0x0) {
                    *(undefined4 *)((long)base + 0x28) = 0;
                    iVar1 = -0x202;
                  }
                  else {
                    lVar4 = SSL_get_verify_result(*(SSL **)((long)base + 0x18));
                    if (lVar4 == 0) goto LAB_0010ae4f;
                    uVar7 = (undefined4)lVar4;
                    iVar1 = -0x202;
LAB_0010ae9d:
                    *(undefined4 *)((long)base + 0x28) = uVar7;
                    X509_free(a);
                  }
                  SSL_shutdown(*(SSL **)((long)base + 0x18));
                  break;
                }
                iVar1 = SSL_get_error(*(SSL **)((long)base + 0x18),iVar1);
                *(int *)((long)base + 0x28) = iVar1;
                if (iVar1 == 3) {
                  iVar1 = *(int *)((long)base + 0x10);
                  iVar2 = 4;
                }
                else {
                  if (iVar1 != 2) {
                    iVar1 = -0x203;
                    break;
                  }
                  iVar1 = *(int *)((long)base + 0x10);
                  iVar2 = 2;
                }
                iVar1 = amqp_poll(iVar1,iVar2,deadline);
              } while (iVar1 == 0);
            }
          }
          amqp_os_socket_close(*(int *)((long)base + 0x10));
        }
        *(undefined4 *)((long)base + 0x10) = 0xffffffff;
        SSL_free(*(SSL **)((long)base + 0x18));
        *(undefined8 *)((long)base + 0x18) = 0;
      }
    }
  }
  else {
    iVar1 = -0x12;
  }
  return iVar1;
}

Assistant:

static int amqp_ssl_socket_open(void *base, const char *host, int port,
                                const struct timeval *timeout) {
  struct amqp_ssl_socket_t *self = (struct amqp_ssl_socket_t *)base;
  long result;
  int status;
  amqp_time_t deadline;
  X509 *cert;
  BIO *bio;
  if (-1 != self->sockfd) {
    return AMQP_STATUS_SOCKET_INUSE;
  }
  ERR_clear_error();

  self->ssl = SSL_new(self->ctx);
  if (!self->ssl) {
    self->internal_error = ERR_peek_error();
    status = AMQP_STATUS_SSL_ERROR;
    goto exit;
  }

  status = amqp_time_from_now(&deadline, timeout);
  if (AMQP_STATUS_OK != status) {
    return status;
  }

  self->sockfd = amqp_open_socket_inner(host, port, deadline);
  if (0 > self->sockfd) {
    status = self->sockfd;
    self->internal_error = amqp_os_socket_error();
    self->sockfd = -1;
    goto error_out1;
  }

  bio = BIO_new(amqp_openssl_bio());
  if (!bio) {
    status = AMQP_STATUS_NO_MEMORY;
    goto error_out2;
  }

  BIO_set_fd(bio, self->sockfd, BIO_NOCLOSE);
  SSL_set_bio(self->ssl, bio, bio);

  status = SSL_set_tlsext_host_name(self->ssl, host);
  if (!status) {
    self->internal_error = SSL_get_error(self->ssl, status);
    status = AMQP_STATUS_SSL_ERROR;
    goto error_out2;
  }

start_connect:
  status = SSL_connect(self->ssl);
  if (status != 1) {
    self->internal_error = SSL_get_error(self->ssl, status);
    switch (self->internal_error) {
      case SSL_ERROR_WANT_READ:
        status = amqp_poll(self->sockfd, AMQP_SF_POLLIN, deadline);
        break;
      case SSL_ERROR_WANT_WRITE:
        status = amqp_poll(self->sockfd, AMQP_SF_POLLOUT, deadline);
        break;
      default:
        status = AMQP_STATUS_SSL_CONNECTION_FAILED;
    }
    if (AMQP_STATUS_OK == status) {
      goto start_connect;
    }
    goto error_out2;
  }

#if OPENSSL_VERSION_NUMBER < 0x30000000L
  cert = SSL_get_peer_certificate(self->ssl);
#else
  cert = SSL_get1_peer_certificate(self->ssl);
#endif

  if (self->verify_peer) {
    if (!cert) {
      self->internal_error = 0;
      status = AMQP_STATUS_SSL_PEER_VERIFY_FAILED;
      goto error_out3;
    }

    result = SSL_get_verify_result(self->ssl);
    if (X509_V_OK != result) {
      self->internal_error = result;
      status = AMQP_STATUS_SSL_PEER_VERIFY_FAILED;
      goto error_out4;
    }
  }
  if (self->verify_hostname) {
    if (!cert) {
      self->internal_error = 0;
      status = AMQP_STATUS_SSL_HOSTNAME_VERIFY_FAILED;
      goto error_out3;
    }

    if (1 != X509_check_host(cert, host, strlen(host),
                             X509_CHECK_FLAG_NO_PARTIAL_WILDCARDS, NULL)) {
      self->internal_error = 0;
      status = AMQP_STATUS_SSL_HOSTNAME_VERIFY_FAILED;
      goto error_out4;
    }
  }

  X509_free(cert);
  self->internal_error = 0;
  status = AMQP_STATUS_OK;

exit:
  return status;

error_out4:
  X509_free(cert);
error_out3:
  SSL_shutdown(self->ssl);
error_out2:
  amqp_os_socket_close(self->sockfd);
  self->sockfd = -1;
error_out1:
  SSL_free(self->ssl);
  self->ssl = NULL;
  goto exit;
}